

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<CborEncoder>::relocate
          (QArrayDataPointer<CborEncoder> *this,qsizetype offset,CborEncoder **data)

{
  bool bVar1;
  CborEncoder *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  CborEncoder *res;
  
  first = (CborEncoder *)(*(long *)(in_RDI + 8) + in_RSI * 0x20);
  QtPrivate::q_relocate_overlap_n<CborEncoder,long_long>(first,in_RDI,(CborEncoder *)0x8e06a7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<CborEncoder>,CborEncoder_const*>
                        (data,(QArrayDataPointer<CborEncoder> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  *(CborEncoder **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }